

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpbyteaddress.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPByteAddress::IsFromSameHost(RTPByteAddress *this,RTPAddress *addr)

{
  _func_int **__n;
  int iVar1;
  
  if (((addr != (RTPAddress *)0x0) && (addr->addresstype == ByteAddress)) &&
     (__n = (_func_int **)this->addresslength, addr[9]._vptr_RTPAddress == __n)) {
    if (__n != (_func_int **)0x0) {
      iVar1 = bcmp(&(this->super_RTPAddress).field_0xc,&addr->field_0xc,(size_t)__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool RTPByteAddress::IsFromSameHost(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != ByteAddress)
		return false;

	const RTPByteAddress *addr2 = (const RTPByteAddress *)addr;
	
	if (addr2->addresslength != addresslength)
		return false;
	if (addresslength == 0 || (memcmp(hostaddress, addr2->hostaddress, addresslength) == 0))
		return true;
	return false;
}